

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Window * windowFind(Parse *pParse,Window *pList,char *zName)

{
  int iVar1;
  
  while( true ) {
    if (pList == (Window *)0x0) {
      sqlite3ErrorMsg(pParse,"no such window: %s",zName);
      return (Window *)0x0;
    }
    iVar1 = sqlite3StrICmp(pList->zName,zName);
    if (iVar1 == 0) break;
    pList = pList->pNextWin;
  }
  return pList;
}

Assistant:

static Window *windowFind(Parse *pParse, Window *pList, const char *zName){
  Window *p;
  for(p=pList; p; p=p->pNextWin){
    if( sqlite3StrICmp(p->zName, zName)==0 ) break;
  }
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such window: %s", zName);
  }
  return p;
}